

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall
ON_SubDComponentList::UpdateSubDForExperts
          (ON_SubDComponentList *this,ON_SubD *subd,bool bUpdateDeletedComponents)

{
  uint i_00;
  bool bVar1;
  ON__UINT64 OVar2;
  ON__UINT64 OVar3;
  ON_SubDComponentPtr *pOVar4;
  ON_SubDComponentBase *this_00;
  ON__UINT_PTR OVar5;
  ON_SubDComponentPtr local_50;
  ON_SubDComponentPtr cptr1;
  ON_COMPONENT_INDEX ci;
  ON_SubDComponentBase *c0;
  ON_SubDComponentPtr cptr0;
  uint i;
  uint count1;
  uint count0;
  bool bUpdateDeletedComponents_local;
  ON_SubD *subd_local;
  ON_SubDComponentList *this_local;
  
  this_local._4_4_ = Count(this);
  OVar2 = ON_SubD::RuntimeSerialNumber(subd);
  OVar3 = ON_SubD::RuntimeSerialNumber(&this->m_subd);
  if (OVar2 != OVar3) {
    cptr0.m_ptr._4_4_ = 0;
    for (cptr0.m_ptr._0_4_ = 0; (uint)cptr0.m_ptr < this_local._4_4_;
        cptr0.m_ptr._0_4_ = (uint)cptr0.m_ptr + 1) {
      pOVar4 = ON_SimpleArray<ON_SubDComponentPtr>::operator[]
                         (&this->m_component_list,(uint)cptr0.m_ptr);
      c0 = (ON_SubDComponentBase *)pOVar4->m_ptr;
      this_00 = ON_SubDComponentPtr::ComponentBase((ON_SubDComponentPtr *)&c0);
      if ((this_00 != (ON_SubDComponentBase *)0x0) &&
         ((bUpdateDeletedComponents || (bVar1 = ON_SubDComponentBase::IsActive(this_00), bVar1)))) {
        cptr1.m_ptr = (ON__UINT_PTR)ON_SubDComponentPtr::ComponentIndex((ON_SubDComponentPtr *)&c0);
        if (cptr1.m_ptr._4_4_ != 0) {
          local_50 = ON_SubD::ComponentPtrFromComponentIndex(subd,(ON_COMPONENT_INDEX)cptr1.m_ptr);
          bVar1 = ON_SubDComponentPtr::IsNull(&local_50);
          if (!bVar1) {
            OVar5 = ON_SubDComponentPtr::ComponentDirection((ON_SubDComponentPtr *)&c0);
            if (OVar5 != 0) {
              ON_SubDComponentPtr::SetComponentDirection(&local_50);
            }
            i_00 = cptr0.m_ptr._4_4_;
            cptr0.m_ptr._4_4_ = cptr0.m_ptr._4_4_ + 1;
            pOVar4 = ON_SimpleArray<ON_SubDComponentPtr>::operator[](&this->m_component_list,i_00);
            pOVar4->m_ptr = local_50.m_ptr;
          }
        }
      }
    }
    ON_SimpleArray<ON_SubDComponentPtr>::SetCount(&this->m_component_list,cptr0.m_ptr._4_4_);
    ON_SubD::ShareDimple(&this->m_subd,subd);
    OVar2 = ON_SubD::RuntimeSerialNumber(&this->m_subd);
    this->m_subd_runtime_serial_number = OVar2;
    OVar2 = ON_SubD::GeometryContentSerialNumber(&this->m_subd);
    this->m_subd_geometry_content_serial_number = OVar2;
    OVar2 = ON_SubD::RenderContentSerialNumber(&this->m_subd);
    this->m_subd_render_content_serial_number = OVar2;
    this_local._4_4_ = Count(this);
  }
  return this_local._4_4_;
}

Assistant:

unsigned int ON_SubDComponentList::UpdateSubDForExperts(const ON_SubD & subd, bool bUpdateDeletedComponents)
{
  const unsigned count0 = Count();
  if (subd.RuntimeSerialNumber() == m_subd.RuntimeSerialNumber())
    return count0; // the components in this list are in subd.

  // Use the component ids to update the list to reference components in subd.
  unsigned count1 = 0;
  for (unsigned i = 0; i < count0; ++i)
  {
    ON_SubDComponentPtr cptr0 = m_component_list[i];
    const ON_SubDComponentBase* c0 = cptr0.ComponentBase();
    if (nullptr == c0)
      continue;
    if (false == bUpdateDeletedComponents && false == c0->IsActive())
      continue;
    ON_COMPONENT_INDEX ci = cptr0.ComponentIndex();
    if (0 == ci.m_index)
      continue;
    ON_SubDComponentPtr cptr1 = subd.ComponentPtrFromComponentIndex(ci);
    if (cptr1.IsNull())
      continue;
    if (0 != cptr0.ComponentDirection())
      cptr1.SetComponentDirection();
    m_component_list[count1++] = cptr1;
  }
  m_component_list.SetCount(count1);
  m_subd.ShareDimple(subd);
  m_subd_runtime_serial_number = m_subd.RuntimeSerialNumber();
  m_subd_geometry_content_serial_number = m_subd.GeometryContentSerialNumber();
  m_subd_render_content_serial_number = m_subd.RenderContentSerialNumber();
  return Count();
}